

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O2

void __thiscall
kj::
OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
::destroy(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *this)

{
  uint uVar1;
  
  uVar1 = this->tag;
  if (uVar1 == 1) {
    this->tag = 0;
    Own<const_kj::File,_std::nullptr_t>::dispose
              ((Own<const_kj::File,_std::nullptr_t> *)&this->field_1);
    uVar1 = this->tag;
  }
  if (uVar1 == 2) {
    this->tag = 0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)&this->field_1);
    uVar1 = this->tag;
  }
  if (uVar1 == 3) {
    this->tag = 0;
    Array<char>::~Array((Array<char> *)((long)&this->field_1 + 8));
    return;
  }
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }